

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::DescriptorScalarReplacement::CreateReplacementVariable
          (DescriptorScalarReplacement *this,Instruction *var,uint32_t idx)

{
  _Rb_tree_header *p_Var1;
  PodType (*paPVar2) [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Op OVar4;
  _Rb_tree_color _Var5;
  IRContext *pIVar6;
  Module *pMVar7;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
  *p_Var8;
  _Base_ptr p_Var9;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  _Var10;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  _Var11;
  string *psVar12;
  size_type sVar13;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> inst;
  pointer puVar14;
  bool bVar15;
  PodType storage_class;
  uint32_t uVar16;
  PodType res_id;
  uint uVar17;
  Instruction *pIVar18;
  Instruction *pIVar19;
  pointer __p;
  long *plVar20;
  __uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
  this_00;
  pointer pOVar21;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_> _Var22;
  uint uVar23;
  _Base_ptr p_Var24;
  uint *puVar25;
  byte bVar26;
  pointer *__ptr;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_01;
  Instruction *pIVar27;
  Operand *__cur;
  Instruction *debug_inst;
  size_type *psVar28;
  size_t byte_index;
  _Base_ptr p_Var29;
  uint *puVar30;
  ulong uVar31;
  long lVar32;
  pointer puVar33;
  bool bVar34;
  bool bVar35;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  pVar36;
  undefined1 local_180 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_160;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_158;
  string result;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_118;
  undefined4 local_110;
  undefined1 local_108 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_e8;
  string name_str;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> new_name;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result_1;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_68;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  names_to_add;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_> local_38;
  
  uVar16 = (var->has_result_id_ & 1) + 1;
  if (var->has_type_id_ == false) {
    uVar16 = (uint)var->has_result_id_;
  }
  storage_class.data._M_elems =
       (array<signed_char,_4UL>)Instruction::GetSingleWordOperand(var,uVar16);
  uVar16 = 0;
  if (var->has_type_id_ == true) {
    uVar16 = Instruction::GetSingleWordOperand(var,0);
  }
  pIVar6 = (this->super_Pass).context_;
  if ((pIVar6->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar6);
  }
  pIVar18 = analysis::DefUseManager::GetDef
                      ((pIVar6->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,uVar16);
  if (pIVar18->opcode_ != OpTypePointer) {
    __assert_fail("ptr_type_inst->opcode() == spv::Op::OpTypePointer && \"Variable should be a pointer to an array or structure.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp"
                  ,0x129,
                  "uint32_t spvtools::opt::DescriptorScalarReplacement::CreateReplacementVariable(Instruction *, uint32_t)"
                 );
  }
  uVar17 = (pIVar18->has_result_id_ & 1) + 1;
  if (pIVar18->has_type_id_ == false) {
    uVar17 = (uint)pIVar18->has_result_id_;
  }
  uVar16 = Instruction::GetSingleWordOperand(pIVar18,uVar17 + 1);
  pIVar6 = (this->super_Pass).context_;
  if ((pIVar6->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar6);
  }
  pIVar18 = analysis::DefUseManager::GetDef
                      ((pIVar6->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,uVar16);
  OVar4 = pIVar18->opcode_;
  if ((OVar4 | OpSourceContinued) != OpTypeStruct) {
    __assert_fail("(is_array || is_struct) && \"Variable should be a pointer to an array or structure.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp"
                  ,0x12f,
                  "uint32_t spvtools::opt::DescriptorScalarReplacement::CreateReplacementVariable(Instruction *, uint32_t)"
                 );
  }
  uVar17 = (pIVar18->has_result_id_ & 1) + 1;
  if (pIVar18->has_type_id_ == false) {
    uVar17 = (uint)pIVar18->has_result_id_;
  }
  uVar16 = 0;
  if (OVar4 != OpTypeArray) {
    uVar16 = idx;
  }
  uVar16 = Instruction::GetSingleWordOperand(pIVar18,uVar16 + uVar17);
  pIVar6 = (this->super_Pass).context_;
  if ((pIVar6->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(pIVar6);
  }
  uVar16 = analysis::TypeManager::FindPointerToType
                     ((pIVar6->type_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                      _M_head_impl,uVar16,(StorageClass)storage_class.data._M_elems);
  res_id.data._M_elems = (array<signed_char,_4UL>)Pass::TakeNextId(&this->super_Pass);
  pIVar19 = (Instruction *)operator_new(0x70);
  pIVar6 = (this->super_Pass).context_;
  local_180._24_8_ = local_180 + 0x10;
  local_180._0_8_ = &PTR__SmallVector_009488e0;
  local_160._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_180._16_4_ = storage_class.data._M_elems;
  local_180._8_8_ = 1;
  result._M_dataplus._M_p._0_4_ = 0x11;
  result._M_string_length = (size_type)&PTR__SmallVector_009488e0;
  result.field_2._M_allocated_capacity = 0;
  local_118 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)&result._M_string_length,
             (SmallVector<unsigned_int,_2UL> *)local_180);
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = (pointer)0x0;
  local_78._0_8_ = (pointer)0x0;
  local_88._0_8_ = operator_new(0x30);
  pOVar21 = (pointer)(local_88._0_8_ + 0x30);
  ((pointer)local_88._0_8_)->type = (spv_operand_type_t)result._M_dataplus._M_p;
  (((pointer)local_88._0_8_)->words)._vptr_SmallVector = (_func_int **)&PTR__SmallVector_009488e0;
  (((pointer)local_88._0_8_)->words).size_ = 0;
  (((pointer)local_88._0_8_)->words).small_data_ = (uint *)(((pointer)local_88._0_8_)->words).buffer
  ;
  (((pointer)local_88._0_8_)->words).large_data_._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_78._0_8_ = pOVar21;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            (&((pointer)local_88._0_8_)->words,
             (SmallVector<unsigned_int,_2UL> *)&result._M_string_length);
  local_88._8_8_ = pOVar21;
  Instruction::Instruction
            (pIVar19,pIVar6,OpVariable,uVar16,(uint32_t)res_id.data._M_elems,
             (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_88);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_88);
  result._M_string_length = (size_type)&PTR__SmallVector_009488e0;
  if (local_118 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_118,local_118);
  }
  local_118 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_180._0_8_ = &PTR__SmallVector_009488e0;
  if (local_160._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_160,local_160._M_head_impl);
  }
  pIVar6 = (this->super_Pass).context_;
  if ((pIVar6->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
    analysis::DefUseManager::AnalyzeInstDefUse
              ((pIVar6->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               pIVar19);
  }
  utils::IntrusiveList<spvtools::opt::Instruction>::push_back
            (&(((pIVar6->module_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->types_values_)
              .super_IntrusiveList<spvtools::opt::Instruction>,pIVar19);
  CopyDecorationsForNewVariable
            (this,var,idx,(uint32_t)res_id.data._M_elems,uVar16,OVar4 == OpTypeArray,
             OVar4 == OpTypeStruct,pIVar18);
  names_to_add.
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  names_to_add.
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  names_to_add.
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar6 = (this->super_Pass).context_;
  uVar16 = 0;
  if (var->has_result_id_ == true) {
    uVar16 = Instruction::GetSingleWordOperand(var,(uint)var->has_type_id_);
  }
  local_180._0_4_ = uVar16;
  if ((pIVar6->valid_analyses_ & kAnalysisNameMap) == kAnalysisNone) {
    __p = (pointer)operator_new(0x30);
    p_Var1 = &(__p->_M_t)._M_impl.super__Rb_tree_header;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    *(undefined8 *)&(__p->_M_t)._M_impl = 0;
    *(undefined8 *)&(__p->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (__p->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    std::
    __uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
    ::reset((__uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
             *)&pIVar6->id_to_name_,__p);
    pMVar7 = (pIVar6->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    pIVar19 = *(Instruction **)
               ((long)&(pMVar7->debugs2_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
    pIVar27 = (Instruction *)
              ((long)&(pMVar7->debugs2_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
    if (pIVar19 != pIVar27) {
      do {
        if (pIVar19->opcode_ - OpName < 2) {
          p_Var8 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
                    *)(pIVar6->id_to_name_)._M_t.
                      super___uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                      .
                      super__Head_base<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_false>
                      ._M_head_impl;
          uVar16 = (pIVar19->has_result_id_ & 1) + 1;
          if (pIVar19->has_type_id_ == false) {
            uVar16 = (uint)pIVar19->has_result_id_;
          }
          uVar16 = Instruction::GetSingleWordOperand(pIVar19,uVar16);
          result._M_dataplus._M_p._0_4_ = uVar16;
          result._M_string_length = (size_type)pIVar19;
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
          ::_M_insert_equal<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>
                    (p_Var8,(pair<const_unsigned_int,_spvtools::opt::Instruction_*> *)&result);
        }
        pIVar19 = (pIVar19->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      } while (pIVar19 != pIVar27);
    }
    *(undefined1 *)&pIVar6->valid_analyses_ = (char)pIVar6->valid_analyses_ | kAnalysisNameMap;
  }
  pVar36 = std::
           _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::_Select1st<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
           ::equal_range(&((pIVar6->id_to_name_)._M_t.
                           super___uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                           .
                           super__Head_base<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_false>
                          ._M_head_impl)->_M_t,(key_type *)local_180);
  if (pVar36.first._M_node._M_node != pVar36.second._M_node._M_node) {
    do {
      local_38 = pVar36.second._M_node;
      p_Var29 = pVar36.first._M_node._M_node[1]._M_parent;
      p_Var24 = p_Var29[1]._M_right;
      if ((ulong)((*(long *)(p_Var29 + 2) - (long)p_Var24 >> 4) * -0x5555555555555555) < 2) {
LAB_005a24fd:
        __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2a0,"Operand &spvtools::opt::Instruction::GetOperand(uint32_t)");
      }
      p_Var9 = p_Var24[2]._M_right;
      p_Var29 = (_Base_ptr)&p_Var24[2]._M_left;
      if (p_Var9 == (_Base_ptr)0x0) {
        p_Var24 = (_Base_ptr)(&(p_Var24[2]._M_left)->_M_color + *(long *)(p_Var24 + 2));
      }
      else {
        p_Var24 = p_Var9->_M_parent;
        p_Var29 = p_Var9;
      }
      p_Var29 = *(_Base_ptr *)p_Var29;
      name_str._M_dataplus._M_p = (pointer)&name_str.field_2;
      name_str._M_string_length = 0;
      name_str.field_2._M_local_buf[0] = '\0';
      bVar35 = p_Var29 == p_Var24;
      if (bVar35) {
        bVar15 = false;
      }
      else {
        bVar15 = false;
        do {
          _Var5 = p_Var29->_M_color;
          bVar26 = 0;
          bVar34 = false;
          uVar31 = 0;
          do {
            if ((char)(_Var5 >> (bVar26 & 0x1f)) == '\0') {
              bVar15 = true;
              break;
            }
            std::__cxx11::string::push_back((char)&name_str);
            bVar34 = 2 < uVar31;
            uVar31 = uVar31 + 1;
            bVar26 = bVar26 + 8;
          } while (uVar31 != 4);
          if (!bVar34) break;
          p_Var29 = (_Base_ptr)&p_Var29->field_0x4;
          bVar35 = p_Var29 == p_Var24;
        } while (!bVar35);
      }
      if (bVar35) {
LAB_005a24de:
        __assert_fail("!assert_found_terminating_null && \"Did not find terminating null for the string.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/string_utils.h"
                      ,0x65,
                      "std::string spvtools::utils::MakeString(InputIt, InputIt, bool) [InputIt = const unsigned int *]"
                     );
      }
      paVar3 = &result.field_2;
      if ((!bVar15) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name_str._M_dataplus._M_p != &name_str.field_2)) {
        operator_delete(name_str._M_dataplus._M_p,
                        CONCAT71(name_str.field_2._M_allocated_capacity._1_7_,
                                 name_str.field_2._M_local_buf[0]) + 1);
      }
      if (OVar4 == OpTypeArray) {
        utils::ToString<unsigned_int>((string *)local_88,idx);
        plVar20 = (long *)std::__cxx11::string::replace((ulong)local_88,0,(char *)0x0,0x77211d);
        paPVar2 = (PodType (*) [2])(plVar20 + 2);
        if ((PodType (*) [2])*plVar20 == paPVar2) {
          local_180._16_8_ = *paPVar2;
          local_180._24_8_ = plVar20[3];
          local_180._0_8_ = (PodType (*) [2])(local_180 + 0x10);
        }
        else {
          local_180._16_8_ = *paPVar2;
          local_180._0_8_ = (PodType (*) [2])*plVar20;
        }
        local_180._8_8_ = plVar20[1];
        *plVar20 = (long)paPVar2;
        plVar20[1] = 0;
        *(undefined1 *)(plVar20 + 2) = 0;
        plVar20 = (long *)std::__cxx11::string::append(local_180);
        psVar28 = (size_type *)(plVar20 + 2);
        if ((size_type *)*plVar20 == psVar28) {
          result.field_2._M_allocated_capacity = *psVar28;
          result.field_2._8_8_ = plVar20[3];
          result._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          result.field_2._M_allocated_capacity = *psVar28;
          result._M_dataplus._M_p = (pointer)*plVar20;
        }
        result._M_string_length = plVar20[1];
        *plVar20 = (long)psVar28;
        plVar20[1] = 0;
        *(undefined1 *)(plVar20 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&name_str,(ulong)result._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)result._M_dataplus._M_p != paVar3) {
          operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
        }
        if ((PodType (*) [2])local_180._0_8_ != (PodType (*) [2])(local_180 + 0x10)) {
          operator_delete((void *)local_180._0_8_,(ulong)(local_180._16_8_ + 1));
        }
        if ((pointer)local_88._0_8_ != (pointer)local_78) {
          operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
        }
      }
      if (OVar4 == OpTypeStruct) {
        pIVar6 = (this->super_Pass).context_;
        uVar16 = 0;
        if (pIVar18->has_result_id_ == true) {
          uVar16 = Instruction::GetSingleWordOperand(pIVar18,(uint)pIVar18->has_type_id_);
        }
        pIVar19 = IRContext::GetMemberName(pIVar6,uVar16,idx);
        std::__cxx11::string::append((char *)&name_str);
        if (pIVar19 == (Instruction *)0x0) {
          utils::ToString<unsigned_int>(&result,idx);
          std::__cxx11::string::_M_append((char *)&name_str,(ulong)result._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)result._M_dataplus._M_p != paVar3) {
LAB_005a2069:
            operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          pOVar21 = (pIVar19->operands_).
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)(((long)(pIVar19->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar21 >> 4) *
                     -0x5555555555555555) < 3) goto LAB_005a24fd;
          _Var10._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = pOVar21[2].words.large_data_._M_t.
                         super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_t;
          _Var11._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          )&pOVar21[2].words.small_data_;
          if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )_Var10._M_t.
                super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                .
                super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                ._M_head_impl == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            puVar25 = pOVar21[2].words.small_data_ + pOVar21[2].words.size_;
          }
          else {
            puVar25 = *(uint **)((long)_Var10._M_t.
                                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                       ._M_head_impl + 8);
            _Var11._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl =
                 _Var10._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl;
          }
          puVar30 = *(uint **)_Var11._M_t.
                              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              .
                              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                              ._M_head_impl;
          result._M_string_length = 0;
          result.field_2._M_allocated_capacity =
               result.field_2._M_allocated_capacity & 0xffffffffffffff00;
          bVar35 = puVar30 == puVar25;
          if (bVar35) {
            bVar15 = false;
            result._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            bVar15 = false;
            result._M_dataplus._M_p = (pointer)paVar3;
            do {
              uVar17 = *puVar30;
              bVar26 = 0;
              bVar34 = false;
              uVar31 = 0;
              do {
                if ((char)(uVar17 >> (bVar26 & 0x1f)) == '\0') {
                  bVar15 = true;
                  break;
                }
                std::__cxx11::string::push_back((char)&result);
                bVar34 = 2 < uVar31;
                uVar31 = uVar31 + 1;
                bVar26 = bVar26 + 8;
              } while (uVar31 != 4);
              if (!bVar34) break;
              puVar30 = puVar30 + 1;
              bVar35 = puVar30 == puVar25;
            } while (!bVar35);
          }
          if (bVar35) goto LAB_005a24de;
          if ((!bVar15) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)result._M_dataplus._M_p != &result.field_2)) {
            operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::_M_append((char *)&name_str,(ulong)result._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)result._M_dataplus._M_p != &result.field_2) goto LAB_005a2069;
        }
      }
      this_00.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            )operator_new(0x70);
      pIVar6 = (this->super_Pass).context_;
      local_180._0_8_ = &PTR__SmallVector_009488e0;
      local_160._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_180._16_4_ = res_id.data._M_elems;
      local_180._8_8_ = 1;
      result._M_dataplus._M_p._0_4_ = 1;
      result._M_string_length = (size_type)&PTR__SmallVector_009488e0;
      result.field_2._M_allocated_capacity = 0;
      local_118 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_180._24_8_ = local_180 + 0x10;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)&result._M_string_length,
                 (SmallVector<unsigned_int,_2UL> *)local_180);
      sVar13 = name_str._M_string_length;
      result_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      result_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      result_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)local_158.
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      uVar31 = 0;
      do {
        uVar17 = 0;
        if (uVar31 < sVar13) {
          uVar17 = (uint)(byte)name_str._M_dataplus._M_p[uVar31];
        }
        uVar23 = (uint)uVar31 & 3;
        uVar17 = uVar17 << (char)uVar23 * '\b' |
                 (uint)local_158.
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        local_158.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_158.
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar17);
        if (uVar23 == 3) {
          if (result_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              result_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&result_1,
                       (iterator)
                       result_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_158);
          }
          else {
            *result_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = uVar17;
            result_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 result_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_158.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)((ulong)local_158.
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
        }
        uVar31 = uVar31 + 1;
      } while (uVar31 <= sVar13);
      if (((int)sVar13 + 1U & 3) != 0) {
        if (result_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            result_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&result_1,
                     (iterator)
                     result_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_158);
        }
        else {
          *result_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish =
               (uint)local_158.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          result_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               result_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      utils::SmallVector<unsigned_int,_2UL>::SmallVector
                ((SmallVector<unsigned_int,_2UL> *)local_88,&result_1);
      local_110 = 0xb;
      local_108._0_8_ = &PTR__SmallVector_009488e0;
      local_108._8_8_ = 0;
      local_108._24_8_ = local_108 + 0x10;
      local_e8._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)local_108,
                 (SmallVector<unsigned_int,_2UL> *)local_88);
      local_158.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar32 = 0x60;
      pOVar21 = (pointer)operator_new(0x60);
      local_158.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = pOVar21 + 2;
      psVar12 = &result;
      local_158.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_start = pOVar21;
      do {
        psVar28 = &psVar12->_M_string_length;
        pOVar21->type = *(spv_operand_type_t *)&(((string *)(psVar28 + -1))->_M_dataplus)._M_p;
        (pOVar21->words)._vptr_SmallVector = (_func_int **)&PTR__SmallVector_009488e0;
        (pOVar21->words).size_ = 0;
        (pOVar21->words).small_data_ = (uint *)(pOVar21->words).buffer;
        (pOVar21->words).large_data_._M_t.
        super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  (&pOVar21->words,(SmallVector<unsigned_int,_2UL> *)psVar28);
        pOVar21 = pOVar21 + 1;
        psVar12 = (string *)(psVar28 + 5);
        lVar32 = lVar32 + -0x30;
      } while (lVar32 != 0);
      local_158.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
      _M_impl.super__Vector_impl_data._M_finish = pOVar21;
      Instruction::Instruction
                ((Instruction *)
                 this_00.
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,pIVar6,
                 OpName,0,0,&local_158);
      new_name._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
              )this_00.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                (&local_158);
      lVar32 = -0x60;
      this_01 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                &local_e8;
      do {
        *(undefined ***)(this_01 + -0x20) = &PTR__SmallVector_009488e0;
        if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_01 !=
            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    (this_01,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_01);
        }
        *(undefined8 *)this_01 = 0;
        this_01 = this_01 + -0x30;
        lVar32 = lVar32 + 0x30;
      } while (lVar32 != 0);
      local_88._0_8_ = &PTR__SmallVector_009488e0;
      if (local_68._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_68,local_68._M_head_impl);
      }
      local_68._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      if (result_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(result_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)result_1.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)result_1.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      local_180._0_8_ = &PTR__SmallVector_009488e0;
      if (local_160._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_160,local_160._M_head_impl);
      }
      inst._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           new_name._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      pIVar6 = (this->super_Pass).context_;
      if ((pIVar6->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar6);
      }
      analysis::DefUseManager::AnalyzeInstDefUse
                ((pIVar6->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,
                 (Instruction *)
                 inst._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
      std::
      vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
      ::
      emplace_back<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
                ((vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
                  *)&names_to_add,&new_name);
      if ((__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           )new_name._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           )0x0) {
        (**(code **)(*(long *)new_name._M_t.
                              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                              _M_head_impl + 8))();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name_str._M_dataplus._M_p != &name_str.field_2) {
        operator_delete(name_str._M_dataplus._M_p,
                        CONCAT71(name_str.field_2._M_allocated_capacity._1_7_,
                                 name_str.field_2._M_local_buf[0]) + 1);
      }
      _Var22._M_node = (_Base_ptr)std::_Rb_tree_increment(pVar36.first._M_node._M_node);
      pVar36.second._M_node = local_38._M_node;
      pVar36.first._M_node = _Var22._M_node;
    } while (_Var22._M_node != local_38._M_node);
  }
  puVar14 = names_to_add.
            super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (names_to_add.
      super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      names_to_add.
      super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar33 = names_to_add.
              super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pIVar6 = (this->super_Pass).context_;
      if (((pIVar6->valid_analyses_ & kAnalysisNameMap) != kAnalysisNone) &&
         (pIVar18 = (puVar33->_M_t).
                    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,
         pIVar18->opcode_ - OpName < 2)) {
        p_Var8 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
                  *)(pIVar6->id_to_name_)._M_t.
                    super___uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                    .
                    super__Head_base<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_false>
                    ._M_head_impl;
        uVar16 = (pIVar18->has_result_id_ & 1) + 1;
        if (pIVar18->has_type_id_ == false) {
          uVar16 = (uint)pIVar18->has_result_id_;
        }
        uVar16 = Instruction::GetSingleWordOperand(pIVar18,uVar16);
        result._M_string_length =
             (size_type)
             (puVar33->_M_t).
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        result._M_dataplus._M_p._0_4_ = uVar16;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
        ::_M_insert_equal<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>
                  (p_Var8,(pair<const_unsigned_int,_spvtools::opt::Instruction_*> *)&result);
      }
      if ((pIVar6->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
        analysis::DefUseManager::AnalyzeInstDefUse
                  ((pIVar6->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,
                   (puVar33->_M_t).
                   super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                   .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
      }
      pIVar18 = (puVar33->_M_t).
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      pMVar7 = (pIVar6->module_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
      (puVar33->_M_t).
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
      utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                (&(pMVar7->debugs2_).super_IntrusiveList<spvtools::opt::Instruction>,pIVar18);
      puVar33 = puVar33 + 1;
    } while (puVar33 != puVar14);
  }
  std::
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ::~vector(&names_to_add);
  return (uint32_t)res_id.data._M_elems;
}

Assistant:

uint32_t DescriptorScalarReplacement::CreateReplacementVariable(
    Instruction* var, uint32_t idx) {
  // The storage class for the new variable is the same as the original.
  spv::StorageClass storage_class =
      static_cast<spv::StorageClass>(var->GetSingleWordInOperand(0));

  // The type for the new variable will be a pointer to type of the elements of
  // the array.
  uint32_t ptr_type_id = var->type_id();
  Instruction* ptr_type_inst = get_def_use_mgr()->GetDef(ptr_type_id);
  assert(ptr_type_inst->opcode() == spv::Op::OpTypePointer &&
         "Variable should be a pointer to an array or structure.");
  uint32_t pointee_type_id = ptr_type_inst->GetSingleWordInOperand(1);
  Instruction* pointee_type_inst = get_def_use_mgr()->GetDef(pointee_type_id);
  const bool is_array = pointee_type_inst->opcode() == spv::Op::OpTypeArray;
  const bool is_struct = pointee_type_inst->opcode() == spv::Op::OpTypeStruct;
  assert((is_array || is_struct) &&
         "Variable should be a pointer to an array or structure.");

  uint32_t element_type_id =
      is_array ? pointee_type_inst->GetSingleWordInOperand(0)
               : pointee_type_inst->GetSingleWordInOperand(idx);

  uint32_t ptr_element_type_id = context()->get_type_mgr()->FindPointerToType(
      element_type_id, storage_class);

  // Create the variable.
  uint32_t id = TakeNextId();
  std::unique_ptr<Instruction> variable(
      new Instruction(context(), spv::Op::OpVariable, ptr_element_type_id, id,
                      std::initializer_list<Operand>{
                          {SPV_OPERAND_TYPE_STORAGE_CLASS,
                           {static_cast<uint32_t>(storage_class)}}}));
  context()->AddGlobalValue(std::move(variable));

  CopyDecorationsForNewVariable(var, idx, id, ptr_element_type_id, is_array,
                                is_struct, pointee_type_inst);

  // Create a new OpName for the replacement variable.
  std::vector<std::unique_ptr<Instruction>> names_to_add;
  for (auto p : context()->GetNames(var->result_id())) {
    Instruction* name_inst = p.second;
    std::string name_str = utils::MakeString(name_inst->GetOperand(1).words);
    if (is_array) {
      name_str += "[" + utils::ToString(idx) + "]";
    }
    if (is_struct) {
      Instruction* member_name_inst =
          context()->GetMemberName(pointee_type_inst->result_id(), idx);
      name_str += ".";
      if (member_name_inst)
        name_str += utils::MakeString(member_name_inst->GetOperand(2).words);
      else
        // In case the member does not have a name assigned to it, use the
        // member index.
        name_str += utils::ToString(idx);
    }

    std::unique_ptr<Instruction> new_name(new Instruction(
        context(), spv::Op::OpName, 0, 0,
        std::initializer_list<Operand>{
            {SPV_OPERAND_TYPE_ID, {id}},
            {SPV_OPERAND_TYPE_LITERAL_STRING, utils::MakeVector(name_str)}}));
    Instruction* new_name_inst = new_name.get();
    get_def_use_mgr()->AnalyzeInstDefUse(new_name_inst);
    names_to_add.push_back(std::move(new_name));
  }

  // We shouldn't add the new names when we are iterating over name ranges
  // above. We can add all the new names now.
  for (auto& new_name : names_to_add)
    context()->AddDebug2Inst(std::move(new_name));

  return id;
}